

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

uint __thiscall llvm::APInt::countTrailingOnesSlowCase(APInt *this)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong *puVar7;
  
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 == 0) {
    return 0;
  }
  uVar5 = (ulong)uVar1 + 0x3f;
  puVar7 = (this->U).pVal;
  uVar3 = (uint)uVar5 & 0xffffffc0;
  lVar6 = 0;
  while (*puVar7 == 0xffffffffffffffff) {
    puVar7 = puVar7 + 1;
    lVar6 = lVar6 + -0x40;
    if ((uVar5 & 0xffffffffffffffc0) + lVar6 == 0) goto LAB_0019a08d;
  }
  uVar5 = *puVar7 ^ 0xffffffffffffffff;
  if (uVar5 == 0) {
    iVar4 = 0x40;
  }
  else {
    lVar2 = 0;
    if (uVar5 != 0) {
      for (; (uVar5 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
      }
    }
    iVar4 = (int)lVar2;
  }
  uVar3 = iVar4 - (int)lVar6;
LAB_0019a08d:
  if (uVar3 <= uVar1) {
    return uVar3;
  }
  __assert_fail("Count <= BitWidth",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x24d,"unsigned int llvm::APInt::countTrailingOnesSlowCase() const");
}

Assistant:

unsigned APInt::countTrailingOnesSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == WORD_MAX; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingOnes(U.pVal[i]);
  assert(Count <= BitWidth);
  return Count;
}